

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_huff.c
# Opt level: O2

block_state deflate_huff(deflate_state *s,int flush)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uchar *puVar4;
  
  while ((s->lookahead != 0 || (fill_window(s), s->lookahead != 0))) {
    bVar1 = s->window[s->strstart];
    uVar3 = s->sym_next;
    s->d_buf[uVar3] = 0;
    s->sym_next = uVar3 + 1;
    s->l_buf[uVar3] = bVar1;
    s->dyn_ltree[bVar1].fc.freq = s->dyn_ltree[bVar1].fc.freq + 1;
    s->lookahead = s->lookahead - 1;
    uVar3 = s->strstart + 1;
    s->strstart = uVar3;
    if (s->sym_next == s->sym_end) {
      iVar2 = s->block_start;
      if ((long)iVar2 < 0) {
        puVar4 = (uchar *)0x0;
      }
      else {
        puVar4 = s->window + iVar2;
      }
      zng_tr_flush_block(s,(char *)puVar4,uVar3 - iVar2,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
  }
  if (flush == 0) {
    return need_more;
  }
  s->insert = 0;
  if (flush != 4) {
    if (s->sym_next != 0) {
      iVar2 = s->block_start;
      if ((long)iVar2 < 0) {
        puVar4 = (uchar *)0x0;
      }
      else {
        puVar4 = s->window + iVar2;
      }
      zng_tr_flush_block(s,(char *)puVar4,s->strstart - iVar2,0);
      s->block_start = s->strstart;
      flush_pending(s->strm);
      if (s->strm->avail_out == 0) {
        return need_more;
      }
    }
    return block_done;
  }
  iVar2 = s->block_start;
  if ((long)iVar2 < 0) {
    puVar4 = (uchar *)0x0;
  }
  else {
    puVar4 = s->window + iVar2;
  }
  zng_tr_flush_block(s,(char *)puVar4,s->strstart - iVar2,1);
  s->block_start = s->strstart;
  flush_pending(s->strm);
  return finish_done - (s->strm->avail_out == 0);
}

Assistant:

Z_INTERNAL block_state deflate_huff(deflate_state *s, int flush) {
    int bflush = 0;         /* set if current block must be flushed */

    for (;;) {
        /* Make sure that we have a literal to write. */
        if (s->lookahead == 0) {
            PREFIX(fill_window)(s);
            if (s->lookahead == 0) {
                if (flush == Z_NO_FLUSH)
                    return need_more;
                break;      /* flush the current block */
            }
        }

        /* Output a literal byte */
        bflush = zng_tr_tally_lit(s, s->window[s->strstart]);
        s->lookahead--;
        s->strstart++;
        if (bflush)
            FLUSH_BLOCK(s, 0);
    }
    s->insert = 0;
    if (flush == Z_FINISH) {
        FLUSH_BLOCK(s, 1);
        return finish_done;
    }
    if (s->sym_next)
        FLUSH_BLOCK(s, 0);
    return block_done;
}